

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::Config::removeAttachment(Config *this,string *parameter)

{
  size_t *psVar1;
  element_type *peVar2;
  _Node *p_Var3;
  
  peVar2 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           _M_create_node<std::__cxx11::string_const&>
                     ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                      &peVar2->attachments_to_remove,parameter);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = (size_t *)
           ((long)&(peVar2->attachments_to_remove).
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar1 = *psVar1 + 1;
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::removeAttachment(std::string const& parameter)
{
    o.m->attachments_to_remove.push_back(parameter);
    return this;
}